

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O3

void on_underlying_io_close_complete(void *context)

{
  if (*(int *)((long)context + 0x68) == 5) {
    *(undefined4 *)((long)context + 0x68) = 0;
    if (*(code **)((long)context + 0x18) != (code *)0x0) {
      (**(code **)((long)context + 0x18))(*(undefined8 *)((long)context + 0x38));
    }
  }
  else if (*(int *)((long)context + 0x68) == 1) {
    *(undefined4 *)((long)context + 0x68) = 0;
    indicate_open_complete((TLS_IO_INSTANCE *)context,IO_OPEN_ERROR);
  }
  close_openssl_instance((TLS_IO_INSTANCE *)context);
  return;
}

Assistant:

static void on_underlying_io_close_complete(void* context)
{
    TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)context;

    switch (tls_io_instance->tlsio_state)
    {
    default:
    case TLSIO_STATE_NOT_OPEN:
    case TLSIO_STATE_OPEN:
    case TLSIO_STATE_IN_HANDSHAKE:
    case TLSIO_STATE_HANDSHAKE_FAILED:
    case TLSIO_STATE_ERROR:
        break;

    case TLSIO_STATE_OPENING_UNDERLYING_IO:
        tls_io_instance->tlsio_state = TLSIO_STATE_NOT_OPEN;
        indicate_open_complete(tls_io_instance, IO_OPEN_ERROR);
        break;

    case TLSIO_STATE_CLOSING:
        tls_io_instance->tlsio_state = TLSIO_STATE_NOT_OPEN;

        if (tls_io_instance->on_io_close_complete != NULL)
        {
            tls_io_instance->on_io_close_complete(tls_io_instance->on_io_close_complete_context);
        }
        break;
    }

    close_openssl_instance(tls_io_instance);
}